

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

string * __thiscall
Json::ValueIteratorBase::name_abi_cxx11_(string *__return_storage_ptr__,ValueIteratorBase *this)

{
  uint uVar1;
  _Base_ptr p_Var2;
  long lVar3;
  
  p_Var2 = (this->current_)._M_node;
  lVar3 = *(long *)(p_Var2 + 1);
  if (lVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    uVar1 = *(uint *)&p_Var2[1]._M_parent;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,lVar3,(ulong)(uVar1 >> 2) + lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING ValueIteratorBase::name() const {
  char const* keey;
  char const* end;
  keey = memberName(&end);
  if (!keey) return JSONCPP_STRING();
  return JSONCPP_STRING(keey, end);
}